

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acto.h
# Opt level: O0

void __thiscall
acto::actor::mem_handler_t<msg_finish,_Wall,_const_msg_finish_&>::invoke
          (mem_handler_t<msg_finish,_Wall,_const_msg_finish_&> *this,
          unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *msg)

{
  Wall *__args;
  pointer pmVar1;
  msg_finish *__args_2;
  actor_ref local_20;
  unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *local_18;
  unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *msg_local;
  mem_handler_t<msg_finish,_Wall,_const_msg_finish_&> *this_local;
  
  __args = this->ptr_;
  local_18 = msg;
  msg_local = (unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> *)this;
  pmVar1 = std::unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>::operator->
                     (msg);
  actor_ref::actor_ref(&local_20,pmVar1->sender,true);
  pmVar1 = std::unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>::get(msg);
  __args_2 = core::message_container<msg_finish,_false>::data
                       ((message_container<msg_finish,_false> *)(pmVar1 + 1));
  std::function<void_(Wall_*,_acto::actor_ref,_const_msg_finish_&)>::operator()
            (&this->func_,__args,&local_20,__args_2);
  actor_ref::~actor_ref(&local_20);
  return;
}

Assistant:

void invoke(std::unique_ptr<core::msg_t> msg) const final {
      func_(ptr_, actor_ref(msg->sender, true),
            static_cast<message_reference_t<M, P>>(*msg.get()).data());
    }